

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcServiceLife::IfcServiceLife(IfcServiceLife *this)

{
  *(undefined ***)&this->field_0x118 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x120 = 0;
  *(char **)&this->field_0x128 = "IfcServiceLife";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__009818c8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x9817e8;
  *(undefined8 *)&this->field_0x118 = 0x9818b0;
  *(undefined8 *)&this->field_0x88 = 0x981810;
  *(undefined8 *)&this->field_0x98 = 0x981838;
  *(undefined8 *)&this->field_0xd0 = 0x981860;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x981888;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcServiceLife() : Object("IfcServiceLife") {}